

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int disposition_set_first(DISPOSITION_HANDLE disposition,delivery_number first_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  DISPOSITION_INSTANCE *disposition_instance;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar2 = 0x21ff;
  }
  else {
    item_value = amqpvalue_create_uint(first_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2207;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,1,item_value);
      iVar2 = 0x220d;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int disposition_set_first(DISPOSITION_HANDLE disposition, delivery_number first_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE first_amqp_value = amqpvalue_create_delivery_number(first_value);
        if (first_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 1, first_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(first_amqp_value);
        }
    }

    return result;
}